

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cpp
# Opt level: O0

void __thiscall EvalParams::Deserialize(EvalParams *this,json *json)

{
  element_type *peVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  shared_ptr<EvalContext> local_28;
  json *local_18;
  json *json_local;
  EvalParams *this_local;
  
  local_18 = json;
  json_local = (json *)this;
  std::make_shared<EvalContext>();
  std::shared_ptr<EvalContext>::operator=(&this->ctx,&local_28);
  std::shared_ptr<EvalContext>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<EvalContext,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->ctx);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_38,json);
  (*(peVar1->super_JsonProtocol)._vptr_JsonProtocol[3])(peVar1,&local_38);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_38);
  return;
}

Assistant:

void EvalParams::Deserialize(nlohmann::json json) {
	ctx = std::make_shared<EvalContext>();
	ctx->Deserialize(json);
}